

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O0

void __thiscall
enact::ReferenceTypename::ReferenceTypename
          (ReferenceTypename *this,optional<enact::Token> *permission,optional<enact::Token> *region
          ,unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
           *referringTypename)

{
  bool bVar1;
  Token *pTVar2;
  bool local_ba;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_96;
  allocator<char> local_95 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *local_28;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *referringTypename_local;
  optional<enact::Token> *region_local;
  optional<enact::Token> *permission_local;
  ReferenceTypename *this_local;
  
  local_28 = referringTypename;
  referringTypename_local =
       (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)region;
  region_local = permission;
  permission_local = (optional<enact::Token> *)this;
  Typename::Typename(&this->super_Typename);
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ReferenceTypename_0016aa10;
  std::optional<enact::Token>::optional(&this->m_permission,permission);
  std::optional<enact::Token>::optional(&this->m_region,region);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->m_referringTypename,referringTypename);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->m_permission);
  local_96 = 0;
  if (bVar1) {
    pTVar2 = std::optional<enact::Token>::operator->(&this->m_permission);
    std::__cxx11::string::string((string *)&local_88,(string *)&pTVar2->lexeme);
  }
  else {
    std::allocator<char>::allocator();
    local_96 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",local_95);
  }
  std::operator+(&local_68,"&",&local_88);
  std::operator+(&local_48,&local_68," ");
  local_ba = std::optional::operator_cast_to_bool((optional *)&this->m_region);
  if (local_ba) {
    pTVar2 = std::optional<enact::Token>::operator->(&this->m_region);
    std::__cxx11::string::string((string *)&local_b8,(string *)&pTVar2->lexeme);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  }
  local_ba = !local_ba;
  std::operator+(&this->m_name,&local_48,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (local_ba) {
    std::allocator<char>::~allocator(&local_b9);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if ((local_96 & 1) != 0) {
    std::allocator<char>::~allocator(local_95);
  }
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(
            std::optional<Token> permission,
            std::optional<Token> region,
            std::unique_ptr<const Typename> referringTypename) :
            m_permission{std::move(permission)},
            m_region{std::move(region)},
            m_referringTypename{std::move(referringTypename)},
            m_name{
                    "&" +
                    (m_permission ? m_permission->lexeme : "") + " " +
                    (m_region ? m_region->lexeme : "")} {
    }